

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSpeedup.c
# Opt level: O0

Abc_Ntk_t *
Abc_NtkSpeedup(Abc_Ntk_t *pNtk,int fUseLutLib,int Percentage,int Degree,int fVerbose,
              int fVeryVerbose)

{
  float tDelta_00;
  int iVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  void *__s;
  Abc_Obj_t *pAVar5;
  Abc_Ntk_t *pAig;
  Vec_Ptr_t *p;
  Vec_Ptr_t *p_00;
  Abc_Obj_t *pAVar6;
  Abc_Obj_t *pAVar7;
  char *pcVar8;
  float fVar9;
  float fVar10;
  uint *puTCEdges;
  int nTimeCris;
  int CounterRes;
  int Counter;
  int k2;
  int k;
  int i;
  float tArrival;
  float tDelta;
  Abc_Obj_t *pFanin2;
  Abc_Obj_t *pFanin;
  Abc_Obj_t *pNode;
  Vec_Ptr_t *vTimeFanins;
  Vec_Ptr_t *vTimeCries;
  Abc_Ntk_t *pNtkNew;
  int fVeryVerbose_local;
  int fVerbose_local;
  int Degree_local;
  int Percentage_local;
  int fUseLutLib_local;
  Abc_Ntk_t *pNtk_local;
  
  fVar9 = Abc_NtkDelayTraceLut(pNtk,fUseLutLib);
  if (fUseLutLib == 0) {
    tDelta_00 = 1.0;
  }
  else {
    tDelta_00 = (fVar9 * (float)Percentage) / 100.0;
  }
  if (fVerbose != 0) {
    printf("Max delay = %.2f. Delta = %.2f. ",(double)fVar9,(double)tDelta_00);
    printf("Using %s model. ");
    if (fUseLutLib != 0) {
      printf("Percentage = %d. ");
    }
    printf("\n");
  }
  iVar1 = Abc_NtkObjNumMax(pNtk);
  __s = malloc((long)iVar1 << 2);
  iVar1 = Abc_NtkObjNumMax(pNtk);
  memset(__s,0,(long)iVar1 << 2);
  for (k2 = 0; iVar1 = Vec_PtrSize(pNtk->vObjs), k2 < iVar1; k2 = k2 + 1) {
    pAVar5 = Abc_NtkObj(pNtk,k2);
    if (((pAVar5 != (Abc_Obj_t *)0x0) && (iVar1 = Abc_ObjIsNode(pAVar5), iVar1 != 0)) &&
       (fVar9 = Abc_ObjSlack(pAVar5), fVar9 < tDelta_00)) {
      uVar2 = Abc_NtkDelayTraceTCEdges(pNtk,pAVar5,tDelta_00,fUseLutLib);
      *(uint *)((long)__s + (long)pAVar5->Id * 4) = uVar2;
    }
  }
  if (fVerbose != 0) {
    puTCEdges._4_4_ = 0;
    nTimeCris = 0;
    for (k2 = 0; iVar1 = Vec_PtrSize(pNtk->vObjs), k2 < iVar1; k2 = k2 + 1) {
      pAVar5 = Abc_NtkObj(pNtk,k2);
      if ((pAVar5 != (Abc_Obj_t *)0x0) && (iVar1 = Abc_ObjIsNode(pAVar5), iVar1 != 0)) {
        for (Counter = 0; iVar1 = Abc_ObjFaninNum(pAVar5), Counter < iVar1; Counter = Counter + 1) {
          pAVar6 = Abc_ObjFanin(pAVar5,Counter);
          iVar1 = Abc_ObjIsCi(pAVar6);
          if ((iVar1 == 0) && (fVar9 = Abc_ObjSlack(pAVar6), fVar9 < tDelta_00)) {
            nTimeCris = nTimeCris + 1;
          }
        }
        iVar1 = Extra_WordCountOnes(*(uint *)((long)__s + (long)pAVar5->Id * 4));
        puTCEdges._4_4_ = iVar1 + puTCEdges._4_4_;
      }
    }
    uVar2 = Abc_NtkGetTotalFanins(pNtk);
    printf("Edges: Total = %7d. 0-slack = %7d. Critical = %7d. Ratio = %4.2f\n",
           ((double)(int)puTCEdges._4_4_ * 1.0) / (double)nTimeCris,(ulong)uVar2,
           (ulong)(uint)nTimeCris);
  }
  pAig = Abc_NtkStrash(pNtk,0,1,0);
  puTCEdges._4_4_ = 0;
  nTimeCris = 0;
  p = Vec_PtrAlloc(0x10);
  p_00 = Vec_PtrAlloc(0x10);
  for (k2 = 0; iVar1 = Vec_PtrSize(pNtk->vObjs), k2 < iVar1; k2 = k2 + 1) {
    pAVar5 = Abc_NtkObj(pNtk,k2);
    if (((pAVar5 != (Abc_Obj_t *)0x0) && (iVar1 = Abc_ObjIsNode(pAVar5), iVar1 != 0)) &&
       (fVar9 = Abc_ObjSlack(pAVar5), fVar9 < tDelta_00)) {
      puTCEdges._0_4_ = 0;
      for (Counter = 0; iVar1 = Abc_ObjFaninNum(pAVar5), Counter < iVar1; Counter = Counter + 1) {
        pAVar6 = Abc_ObjFanin(pAVar5,Counter);
        iVar1 = Abc_ObjIsCi(pAVar6);
        if ((iVar1 == 0) &&
           ((*(uint *)((long)__s + (long)pAVar5->Id * 4) & 1 << ((byte)Counter & 0x1f)) != 0)) {
          puTCEdges._0_4_ = (uint)puTCEdges + 1;
        }
      }
      if ((fVeryVerbose != 0) || ((uint)puTCEdges != 0)) {
        nTimeCris = nTimeCris + 1;
        Vec_PtrClear(p);
        if ((uint)puTCEdges != 0) {
          for (Counter = 0; iVar1 = Abc_ObjFaninNum(pAVar5), Counter < iVar1; Counter = Counter + 1)
          {
            pAVar6 = Abc_ObjFanin(pAVar5,Counter);
            iVar1 = Abc_ObjIsCi(pAVar6);
            if ((iVar1 == 0) &&
               ((*(uint *)((long)__s + (long)pAVar5->Id * 4) & 1 << ((byte)Counter & 0x1f)) != 0)) {
              for (CounterRes = 0; iVar1 = Abc_ObjFaninNum(pAVar6), CounterRes < iVar1;
                  CounterRes = CounterRes + 1) {
                pAVar7 = Abc_ObjFanin(pAVar6,CounterRes);
                if ((*(uint *)((long)__s + (long)pAVar6->Id * 4) & 1 << ((byte)CounterRes & 0x1f))
                    != 0) {
                  Vec_PtrPushUnique(p,pAVar7);
                }
              }
            }
          }
        }
        iVar1 = Vec_PtrSize(p);
        if ((iVar1 != 0) && (iVar1 = Vec_PtrSize(p), iVar1 <= Degree)) {
          puTCEdges._4_4_ = puTCEdges._4_4_ + 1;
          Vec_PtrClear(p_00);
          for (Counter = 0; iVar1 = Abc_ObjFaninNum(pAVar5), Counter < iVar1; Counter = Counter + 1)
          {
            pAVar6 = Abc_ObjFanin(pAVar5,Counter);
            iVar1 = Abc_ObjIsCi(pAVar6);
            if (iVar1 == 0) {
              for (CounterRes = 0; iVar1 = Abc_ObjFaninNum(pAVar6), CounterRes < iVar1;
                  CounterRes = CounterRes + 1) {
                pAVar7 = Abc_ObjFanin(pAVar6,CounterRes);
                Vec_PtrPushUnique(p_00,pAVar7);
              }
            }
            else {
              Vec_PtrPushUnique(p_00,pAVar6);
            }
          }
          if (fVeryVerbose != 0) {
            uVar2 = pAVar5->Id;
            uVar3 = Vec_PtrSize(p);
            uVar4 = Vec_PtrSize(p_00);
            printf("%5d Node %5d : %d %2d %2d  ",(ulong)(uint)nTimeCris,(ulong)uVar2,
                   (ulong)(uint)puTCEdges,(ulong)uVar3,(ulong)uVar4);
            for (Counter = 0; iVar1 = Abc_ObjFaninNum(pAVar5), Counter < iVar1;
                Counter = Counter + 1) {
              pAVar6 = Abc_ObjFanin(pAVar5,Counter);
              uVar2 = pAVar6->Id;
              fVar9 = Abc_ObjSlack(pAVar6);
              pcVar8 = "";
              if ((*(uint *)((long)__s + (long)pAVar5->Id * 4) & 1 << ((byte)Counter & 0x1f)) != 0)
              {
                pcVar8 = "*";
              }
              printf("%d(%.2f)%s ",(double)fVar9,(ulong)uVar2,pcVar8);
            }
            printf("\n");
          }
          iVar1 = Vec_PtrSize(p);
          if ((iVar1 != 0) && (iVar1 = Vec_PtrSize(p), iVar1 <= Degree)) {
            iVar1 = Vec_PtrSize(p);
            if (1 < iVar1) {
              pAVar6 = (Abc_Obj_t *)Vec_PtrEntry(p,0);
              pAVar7 = (Abc_Obj_t *)Vec_PtrEntry(p,1);
              fVar9 = Abc_ObjSlack(pAVar6);
              fVar10 = Abc_ObjSlack(pAVar7);
              if (fVar9 < fVar10) {
                Vec_PtrWriteEntry(p,0,pAVar7);
                Vec_PtrWriteEntry(p,1,pAVar6);
              }
            }
            iVar1 = Vec_PtrSize(p);
            if (2 < iVar1) {
              pAVar6 = (Abc_Obj_t *)Vec_PtrEntry(p,1);
              pAVar7 = (Abc_Obj_t *)Vec_PtrEntry(p,2);
              fVar9 = Abc_ObjSlack(pAVar6);
              fVar10 = Abc_ObjSlack(pAVar7);
              if (fVar9 < fVar10) {
                Vec_PtrWriteEntry(p,1,pAVar7);
                Vec_PtrWriteEntry(p,2,pAVar6);
              }
              pAVar6 = (Abc_Obj_t *)Vec_PtrEntry(p,0);
              pAVar7 = (Abc_Obj_t *)Vec_PtrEntry(p,1);
              fVar9 = Abc_ObjSlack(pAVar6);
              fVar10 = Abc_ObjSlack(pAVar7);
              if (fVar9 < fVar10) {
                Vec_PtrWriteEntry(p,0,pAVar7);
                Vec_PtrWriteEntry(p,1,pAVar6);
              }
            }
            Abc_NtkSpeedupNode(pNtk,pAig,pAVar5,p_00,p);
          }
        }
      }
    }
  }
  Vec_PtrFree(p);
  Vec_PtrFree(p_00);
  if (__s != (void *)0x0) {
    free(__s);
  }
  if (fVerbose != 0) {
    uVar2 = Abc_NtkNodeNum(pNtk);
    printf("Nodes: Total = %7d. 0-slack = %7d. Workable = %7d. Ratio = %4.2f\n",
           ((double)(int)puTCEdges._4_4_ * 1.0) / (double)nTimeCris,(ulong)uVar2,
           (ulong)(uint)nTimeCris,(ulong)puTCEdges._4_4_);
  }
  for (k2 = 0; iVar1 = Vec_PtrSize(pAig->vObjs), k2 < iVar1; k2 = k2 + 1) {
    pAVar5 = Abc_NtkObj(pAig,k2);
    if ((((pAVar5 != (Abc_Obj_t *)0x0) && (iVar1 = Abc_AigNodeIsAnd(pAVar5), iVar1 != 0)) &&
        ((pAVar5->field_5).pData != (void *)0x0)) &&
       (iVar1 = Abc_ObjFanoutNum((Abc_Obj_t *)(pAVar5->field_5).pData), 0 < iVar1)) {
      (pAVar5->field_5).pData = (void *)0x0;
    }
  }
  return pAig;
}

Assistant:

Abc_Ntk_t * Abc_NtkSpeedup( Abc_Ntk_t * pNtk, int fUseLutLib, int Percentage, int Degree, int fVerbose, int fVeryVerbose )
{
    Abc_Ntk_t * pNtkNew;
    Vec_Ptr_t * vTimeCries, * vTimeFanins;
    Abc_Obj_t * pNode, * pFanin, * pFanin2;
    float tDelta, tArrival;
    int i, k, k2, Counter, CounterRes, nTimeCris;
    unsigned * puTCEdges;
    // perform delay trace
    tArrival = Abc_NtkDelayTraceLut( pNtk, fUseLutLib );
    tDelta = fUseLutLib ? tArrival*Percentage/100.0 : 1.0;
    if ( fVerbose )
    {
        printf( "Max delay = %.2f. Delta = %.2f. ", tArrival, tDelta );
        printf( "Using %s model. ", fUseLutLib? "LUT library" : "unit-delay" );
        if ( fUseLutLib )
            printf( "Percentage = %d. ", Percentage );
        printf( "\n" );
    }
    // mark the timing critical nodes and edges
    puTCEdges = ABC_ALLOC( unsigned, Abc_NtkObjNumMax(pNtk) );
    memset( puTCEdges, 0, sizeof(unsigned) * Abc_NtkObjNumMax(pNtk) );
    Abc_NtkForEachNode( pNtk, pNode, i )
    {
        if ( Abc_ObjSlack(pNode) >= tDelta )
            continue;
        puTCEdges[pNode->Id] = Abc_NtkDelayTraceTCEdges( pNtk, pNode, tDelta, fUseLutLib );
    }
    if ( fVerbose )
    {
        Counter = CounterRes = 0;
        Abc_NtkForEachNode( pNtk, pNode, i )
        {
            Abc_ObjForEachFanin( pNode, pFanin, k )
                if ( !Abc_ObjIsCi(pFanin) && Abc_ObjSlack(pFanin) < tDelta )
                    Counter++;
            CounterRes += Extra_WordCountOnes( puTCEdges[pNode->Id] );
        }
        printf( "Edges: Total = %7d. 0-slack = %7d. Critical = %7d. Ratio = %4.2f\n", 
            Abc_NtkGetTotalFanins(pNtk), Counter, CounterRes, 1.0*CounterRes/Counter );
    }
    // start the resulting network
    pNtkNew = Abc_NtkStrash( pNtk, 0, 1, 0 );

    // collect nodes to be used for resynthesis
    Counter = CounterRes = 0;
    vTimeCries = Vec_PtrAlloc( 16 );
    vTimeFanins = Vec_PtrAlloc( 16 );
    Abc_NtkForEachNode( pNtk, pNode, i )
    {
        if ( Abc_ObjSlack(pNode) >= tDelta )
            continue;
        // count the number of non-PI timing-critical nodes
        nTimeCris = 0;
        Abc_ObjForEachFanin( pNode, pFanin, k )
            if ( !Abc_ObjIsCi(pFanin) && (puTCEdges[pNode->Id] & (1<<k)) )
                nTimeCris++;
        if ( !fVeryVerbose && nTimeCris == 0 )
            continue;
        Counter++;
        // count the total number of timing critical second-generation nodes
        Vec_PtrClear( vTimeCries );
        if ( nTimeCris )
        {
            Abc_ObjForEachFanin( pNode, pFanin, k )
                if ( !Abc_ObjIsCi(pFanin) && (puTCEdges[pNode->Id] & (1<<k)) )
                    Abc_ObjForEachFanin( pFanin, pFanin2, k2 )
                        if ( puTCEdges[pFanin->Id] & (1<<k2) )
                            Vec_PtrPushUnique( vTimeCries, pFanin2 );
        }
//        if ( !fVeryVerbose && (Vec_PtrSize(vTimeCries) == 0 || Vec_PtrSize(vTimeCries) > Degree) )
        if ( (Vec_PtrSize(vTimeCries) == 0 || Vec_PtrSize(vTimeCries) > Degree) )
            continue;
        CounterRes++;
        // collect second generation nodes
        Vec_PtrClear( vTimeFanins );
        Abc_ObjForEachFanin( pNode, pFanin, k )
        {
            if ( Abc_ObjIsCi(pFanin) )
                Vec_PtrPushUnique( vTimeFanins, pFanin );
            else
                Abc_ObjForEachFanin( pFanin, pFanin2, k2 )
                    Vec_PtrPushUnique( vTimeFanins, pFanin2 );                    
        }
        // print the results
        if ( fVeryVerbose )
        {
        printf( "%5d Node %5d : %d %2d %2d  ", Counter, pNode->Id, 
            nTimeCris, Vec_PtrSize(vTimeCries), Vec_PtrSize(vTimeFanins) );
        Abc_ObjForEachFanin( pNode, pFanin, k )
            printf( "%d(%.2f)%s ", pFanin->Id, Abc_ObjSlack(pFanin), (puTCEdges[pNode->Id] & (1<<k))? "*":"" );
        printf( "\n" );
        }
        // add the node to choices
        if ( Vec_PtrSize(vTimeCries) == 0 || Vec_PtrSize(vTimeCries) > Degree )
            continue;
        // order the fanins in the increasing order of criticalily
        if ( Vec_PtrSize(vTimeCries) > 1 )
        {
            pFanin = (Abc_Obj_t *)Vec_PtrEntry( vTimeCries, 0 );
            pFanin2 = (Abc_Obj_t *)Vec_PtrEntry( vTimeCries, 1 );
            if ( Abc_ObjSlack(pFanin) < Abc_ObjSlack(pFanin2) )
            {
                Vec_PtrWriteEntry( vTimeCries, 0, pFanin2 );
                Vec_PtrWriteEntry( vTimeCries, 1, pFanin );
            }
        }
        if ( Vec_PtrSize(vTimeCries) > 2 )
        {
            pFanin = (Abc_Obj_t *)Vec_PtrEntry( vTimeCries, 1 );
            pFanin2 = (Abc_Obj_t *)Vec_PtrEntry( vTimeCries, 2 );
            if ( Abc_ObjSlack(pFanin) < Abc_ObjSlack(pFanin2) )
            {
                Vec_PtrWriteEntry( vTimeCries, 1, pFanin2 );
                Vec_PtrWriteEntry( vTimeCries, 2, pFanin );
            }
            pFanin = (Abc_Obj_t *)Vec_PtrEntry( vTimeCries, 0 );
            pFanin2 = (Abc_Obj_t *)Vec_PtrEntry( vTimeCries, 1 );
            if ( Abc_ObjSlack(pFanin) < Abc_ObjSlack(pFanin2) )
            {
                Vec_PtrWriteEntry( vTimeCries, 0, pFanin2 );
                Vec_PtrWriteEntry( vTimeCries, 1, pFanin );
            }
        }
        // add choice
        Abc_NtkSpeedupNode( pNtk, pNtkNew, pNode, vTimeFanins, vTimeCries );
    }
    Vec_PtrFree( vTimeCries );
    Vec_PtrFree( vTimeFanins );
    ABC_FREE( puTCEdges );
    if ( fVerbose )
        printf( "Nodes: Total = %7d. 0-slack = %7d. Workable = %7d. Ratio = %4.2f\n", 
            Abc_NtkNodeNum(pNtk), Counter, CounterRes, 1.0*CounterRes/Counter ); 

    // remove invalid choice nodes
    Abc_AigForEachAnd( pNtkNew, pNode, i )
        if ( pNode->pData )
        {
            if ( Abc_ObjFanoutNum((Abc_Obj_t *)pNode->pData) > 0 )
                pNode->pData = NULL;
        }

    // return the result
    return pNtkNew;
}